

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int pk_get_pk_alg(uchar **p,uchar *end,mbedtls_pk_type_t *pk_alg,mbedtls_asn1_buf *params,
                 mbedtls_ecp_group_id *ec_grp_id)

{
  int iVar1;
  undefined1 local_40 [8];
  mbedtls_asn1_buf alg_oid;
  
  *(undefined8 *)params = 0;
  params->len = 0;
  params->p = (uchar *)0x0;
  iVar1 = mbedtls_asn1_get_alg(p,end,(mbedtls_asn1_buf *)local_40,params);
  if (iVar1 != 0) {
    return iVar1 + -0x3a80;
  }
  iVar1 = mbedtls_oid_get_pk_alg((mbedtls_asn1_buf *)local_40,pk_alg);
  if (iVar1 == 0) {
    if (*pk_alg == MBEDTLS_PK_RSA) {
      if ((params->tag != 5) && (params->tag != 0)) {
        return -0x3a80;
      }
      if (params->len != 0) {
        return -0x3a80;
      }
    }
  }
  else {
    if (iVar1 != -0x2e) {
      return -0x3c80;
    }
    iVar1 = mbedtls_oid_get_ec_grp_algid((mbedtls_asn1_buf *)local_40,ec_grp_id);
    if (iVar1 != 0) {
      return -0x3c80;
    }
    *pk_alg = MBEDTLS_PK_ECKEY;
  }
  return 0;
}

Assistant:

static int pk_get_pk_alg(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_pk_type_t *pk_alg, mbedtls_asn1_buf *params,
                         mbedtls_ecp_group_id *ec_grp_id)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf alg_oid;

    memset(params, 0, sizeof(mbedtls_asn1_buf));

    if ((ret = mbedtls_asn1_get_alg(p, end, &alg_oid, params)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_ALG, ret);
    }

    ret = mbedtls_oid_get_pk_alg(&alg_oid, pk_alg);
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (ret == MBEDTLS_ERR_OID_NOT_FOUND) {
        ret = mbedtls_oid_get_ec_grp_algid(&alg_oid, ec_grp_id);
        if (ret == 0) {
            *pk_alg = MBEDTLS_PK_ECKEY;
        }
    }
#else
    (void) ec_grp_id;
#endif
    if (ret != 0) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    /*
     * No parameters with RSA (only for EC)
     */
    if (*pk_alg == MBEDTLS_PK_RSA &&
        ((params->tag != MBEDTLS_ASN1_NULL && params->tag != 0) ||
         params->len != 0)) {
        return MBEDTLS_ERR_PK_INVALID_ALG;
    }

    return 0;
}